

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall
Assimp::IFC::Schema_2x3::IfcLocalPlacement::IfcLocalPlacement(IfcLocalPlacement *this)

{
  IfcLocalPlacement *this_local;
  
  STEP::Object::Object((Object *)&this->field_0x40,"IfcLocalPlacement");
  IfcObjectPlacement::IfcObjectPlacement
            ((IfcObjectPlacement *)this,&PTR_construction_vtable_24__0107c268);
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcLocalPlacement,_2UL>::ObjectHelper
            (&this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcLocalPlacement,_2UL>,
             &PTR_construction_vtable_24__0107c288);
  *(undefined8 *)this = 0x107c200;
  *(undefined8 *)&this->field_0x40 = 0x107c250;
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcLocalPlacement,_2UL>)._vptr_ObjectHelper =
       (_func_int **)0x107c228;
  STEP::Maybe<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcObjectPlacement>_>::Maybe
            ((Maybe<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcObjectPlacement>_> *)
             &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcLocalPlacement,_2UL>).field_0x10
            );
  std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>::shared_ptr
            ((shared_ptr<const_Assimp::STEP::EXPRESS::DataType> *)
             &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcLocalPlacement,_2UL>).field_0x20
            );
  return;
}

Assistant:

IfcLocalPlacement() : Object("IfcLocalPlacement") {}